

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c++
# Opt level: O1

Builder * capnp::compiler::anon_unknown_0::initMemberDecl
                    (Builder *__return_storage_ptr__,Builder builder,
                    Located<capnp::Text::Reader> *name,
                    Orphan<capnp::compiler::LocatedInteger> *ordinal,
                    Array<capnp::Orphan<capnp::compiler::Declaration::AnnotationApplication>_>
                    *annotations)

{
  Orphan<capnp::compiler::Declaration::AnnotationApplication> *pOVar1;
  StructBuilder other;
  uint uVar2;
  ulong uVar3;
  Builder list;
  StructBuilder local_d0;
  StructBuilder local_a8;
  ListBuilder local_80;
  StructBuilder local_58;
  
  local_d0.segment = builder._builder.segment;
  local_d0.capTable = builder._builder.capTable;
  local_d0.data = builder._builder.pointers;
  capnp::_::PointerBuilder::initStruct(&local_58,(PointerBuilder *)&local_d0,(StructSize)0x10001);
  local_d0.segment = local_58.segment;
  local_d0.capTable = local_58.capTable;
  local_d0.data = local_58.pointers;
  capnp::_::PointerBuilder::setBlob<capnp::Text>
            ((PointerBuilder *)&local_d0,(Reader)(name->value).super_StringPtr.content);
  *(uint32_t *)local_58.data = name->startByte;
  *(uint32_t *)((long)local_58.data + 4) = name->endByte;
  *(undefined2 *)builder._builder.data = 2;
  local_d0.data = builder._builder.pointers + 1;
  local_d0.segment = builder._builder.segment;
  local_d0.capTable = builder._builder.capTable;
  capnp::_::PointerBuilder::adopt((PointerBuilder *)&local_d0,&ordinal->builder);
  local_d0.data = builder._builder.pointers + 3;
  local_d0.segment = builder._builder.segment;
  local_d0.capTable = builder._builder.capTable;
  capnp::_::PointerBuilder::initStructList
            (&local_80,(PointerBuilder *)&local_d0,(ElementCount)annotations->size_,
             (StructSize)0x20001);
  if (annotations->size_ != 0) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      pOVar1 = annotations->ptr;
      capnp::_::ListBuilder::getStructElement(&local_d0,&local_80,uVar2 - 1);
      capnp::_::OrphanBuilder::asStruct(&local_a8,&pOVar1[uVar3].builder,(StructSize)0x0);
      other.capTable = local_a8.capTable;
      other.segment = local_a8.segment;
      other.data = local_a8.data;
      other.pointers = local_a8.pointers;
      other.dataSize = local_a8.dataSize;
      other.pointerCount = local_a8.pointerCount;
      other._38_2_ = local_a8._38_2_;
      capnp::_::StructBuilder::transferContentFrom(&local_d0,other);
      uVar3 = (ulong)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar3 < annotations->size_);
  }
  (__return_storage_ptr__->_builder).dataSize = builder._builder.dataSize;
  (__return_storage_ptr__->_builder).pointerCount = builder._builder.pointerCount;
  *(undefined2 *)&(__return_storage_ptr__->_builder).field_0x26 = builder._builder._38_2_;
  (__return_storage_ptr__->_builder).data = builder._builder.data;
  (__return_storage_ptr__->_builder).pointers = builder._builder.pointers;
  (__return_storage_ptr__->_builder).segment = builder._builder.segment;
  (__return_storage_ptr__->_builder).capTable = builder._builder.capTable;
  return __return_storage_ptr__;
}

Assistant:

static Declaration::Builder initMemberDecl(
    Declaration::Builder builder, Located<Text::Reader>&& name,
    Orphan<LocatedInteger>&& ordinal,
    kj::Array<Orphan<Declaration::AnnotationApplication>>&& annotations) {
  name.copyTo(builder.initName());
  builder.getId().adoptOrdinal(kj::mv(ordinal));
  auto list = builder.initAnnotations(annotations.size());
  for (uint i = 0; i < annotations.size(); i++) {
    list.adoptWithCaveats(i, kj::mv(annotations[i]));
  }
  return builder;
}